

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# diff.c
# Opt level: O3

LY_ERR lyd_diff_attrs(lyd_node *first,lyd_node *second,uint16_t options,lyd_diff_op *op,
                     char **orig_default,char **orig_value)

{
  ushort uVar1;
  lysc_node *plVar2;
  lysc_node *plVar3;
  bool bVar4;
  LY_ERR LVar5;
  lyd_diff_op lVar6;
  lyd_node *plVar7;
  uint uVar8;
  char *pcVar9;
  lyd_node *__s;
  bool bVar10;
  
  if (first == (lyd_node *)0x0 && second == (lyd_node *)0x0) {
    __assert_fail("first || second",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/diff.c",
                  0x2f7,
                  "LY_ERR lyd_diff_attrs(const struct lyd_node *, const struct lyd_node *, uint16_t, enum lyd_diff_op *, const char **, char **)"
                 );
  }
  *orig_default = (char *)0x0;
  *orig_value = (char *)0x0;
  plVar7 = second;
  if (first != (lyd_node *)0x0) {
    plVar7 = first;
  }
  plVar2 = plVar7->schema;
  if (((plVar2 != (lysc_node *)0x0) && ((plVar2->nodetype & 0x18) != 0)) &&
     ((plVar2->flags & 0x40) != 0)) {
    __assert_fail("!lysc_is_userordered(schema)",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/diff.c",
                  0x2fd,
                  "LY_ERR lyd_diff_attrs(const struct lyd_node *, const struct lyd_node *, uint16_t, enum lyd_diff_op *, const char **, char **)"
                 );
  }
  bVar10 = second == (lyd_node *)0x0;
  bVar4 = true;
  if (first != (lyd_node *)0x0 && !bVar10) {
    uVar1 = plVar2->nodetype;
    if (uVar1 < 0x20) {
      if (uVar1 < 8) {
        if (uVar1 == 1) {
          return LY_ENOT;
        }
        if (uVar1 != 4) goto LAB_0011984c;
        goto LAB_001197e4;
      }
      if ((uVar1 != 8) && (uVar1 != 0x10)) goto LAB_0011984c;
      if ((options & 1) == 0) {
        return LY_ENOT;
      }
      uVar8 = second->flags ^ first->flags;
    }
    else {
      if (0xff < uVar1) {
        if (uVar1 == 0x100) {
          return LY_ENOT;
        }
        if (uVar1 == 0x200) {
          return LY_ENOT;
        }
        if (uVar1 == 0x400) {
          return LY_ENOT;
        }
LAB_0011984c:
        ly_log(plVar2->module->ctx,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
               "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/diff.c",0x325
              );
        return LY_EINT;
      }
      if ((uVar1 != 0x20) && (uVar1 != 0x60)) goto LAB_0011984c;
LAB_001197e4:
      LVar5 = lyd_compare_single(first,second,0);
      if (LVar5 != LY_SUCCESS) {
        lVar6 = LYD_DIFF_OP_REPLACE;
        bVar4 = false;
        goto LAB_001196ee;
      }
      if ((options & 1) == 0) {
        return LY_ENOT;
      }
      uVar8 = second->flags ^ first->flags;
    }
    bVar4 = true;
    lVar6 = LYD_DIFF_OP_NONE;
    if ((uVar8 & 1) == 0) {
      return LY_ENOT;
    }
  }
  else {
    lVar6 = (lyd_diff_op)bVar10;
  }
LAB_001196ee:
  *op = lVar6;
  uVar1 = plVar2->nodetype;
  if ((first != (lyd_node *)0x0 && !bVar10) && (uVar1 & 0xc) != 0) {
    pcVar9 = "true";
    if ((first->flags & 1) == 0) {
      pcVar9 = "false";
    }
    *orig_default = pcVar9;
  }
  if ((uVar1 & 100) == 0 || bVar4) {
    return LY_SUCCESS;
  }
  if (uVar1 != 4) {
    LVar5 = lyd_any_value_str(first,orig_value);
    if (LVar5 == LY_SUCCESS) {
      return LY_SUCCESS;
    }
    return LVar5;
  }
  if (first != (lyd_node *)0x0) {
    plVar3 = first->schema;
    if (plVar3 == (lysc_node *)0x0) {
      plVar7 = first[1].prev;
      goto LAB_00119883;
    }
    if ((plVar3->nodetype & 0xc) != 0) {
      plVar7 = *(lyd_node **)(first + 1);
      if (plVar7 == (lyd_node *)0x0) {
        plVar7 = (lyd_node *)lyd_value_get_canonical(plVar3->module->ctx,(lyd_value *)(first + 1));
      }
      goto LAB_00119883;
    }
  }
  plVar7 = (lyd_node *)0x0;
LAB_00119883:
  __s = (lyd_node *)0x1d59b8;
  if (plVar7 != (lyd_node *)0x0) {
    __s = plVar7;
  }
  pcVar9 = strdup((char *)__s);
  *orig_value = pcVar9;
  if (pcVar9 != (char *)0x0) {
    return LY_SUCCESS;
  }
  ly_log(plVar2->module->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lyd_diff_attrs");
  return LY_EMEM;
}

Assistant:

static LY_ERR
lyd_diff_attrs(const struct lyd_node *first, const struct lyd_node *second, uint16_t options, enum lyd_diff_op *op,
        const char **orig_default, char **orig_value)
{
    const struct lysc_node *schema;
    const char *str_val;

    assert(first || second);

    *orig_default = NULL;
    *orig_value = NULL;

    schema = first ? first->schema : second->schema;
    assert(!lysc_is_userordered(schema));

    /* learn operation first */
    if (!second) {
        *op = LYD_DIFF_OP_DELETE;
    } else if (!first) {
        *op = LYD_DIFF_OP_CREATE;
    } else {
        switch (schema->nodetype) {
        case LYS_CONTAINER:
        case LYS_RPC:
        case LYS_ACTION:
        case LYS_NOTIF:
            /* no changes */
            return LY_ENOT;
        case LYS_LIST:
        case LYS_LEAFLIST:
            if ((options & LYD_DIFF_DEFAULTS) && ((first->flags & LYD_DEFAULT) != (second->flags & LYD_DEFAULT))) {
                /* default flag change */
                *op = LYD_DIFF_OP_NONE;
            } else {
                /* no changes */
                return LY_ENOT;
            }
            break;
        case LYS_LEAF:
        case LYS_ANYXML:
        case LYS_ANYDATA:
            if (lyd_compare_single(first, second, 0)) {
                /* different values */
                *op = LYD_DIFF_OP_REPLACE;
            } else if ((options & LYD_DIFF_DEFAULTS) && ((first->flags & LYD_DEFAULT) != (second->flags & LYD_DEFAULT))) {
                /* default flag change */
                *op = LYD_DIFF_OP_NONE;
            } else {
                /* no changes */
                return LY_ENOT;
            }
            break;
        default:
            LOGINT_RET(schema->module->ctx);
        }
    }

    /*
     * set each attribute correctly based on the operation and node type
     */

    /* orig-default */
    if ((schema->nodetype & LYD_NODE_TERM) && ((*op == LYD_DIFF_OP_REPLACE) || (*op == LYD_DIFF_OP_NONE))) {
        if (first->flags & LYD_DEFAULT) {
            *orig_default = "true";
        } else {
            *orig_default = "false";
        }
    }

    /* orig-value */
    if ((schema->nodetype & (LYS_LEAF | LYS_ANYDATA)) && (*op == LYD_DIFF_OP_REPLACE)) {
        if (schema->nodetype == LYS_LEAF) {
            str_val = lyd_get_value(first);
            *orig_value = strdup(str_val ? str_val : "");
            LY_CHECK_ERR_RET(!*orig_value, LOGMEM(schema->module->ctx), LY_EMEM);
        } else {
            LY_CHECK_RET(lyd_any_value_str(first, orig_value));
        }
    }

    return LY_SUCCESS;
}